

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

void __thiscall ArrayType::GenCleanUpCode(ArrayType *this,Output *out_cc,Env *env)

{
  _func_int **pp_Var1;
  bool bVar2;
  void *pvVar3;
  ID *pIVar4;
  char *pcVar5;
  char *pcVar6;
  ID *in_RDX;
  Env *in_RSI;
  Type *in_RDI;
  ID *elem_var;
  Type *in_stack_ffffffffffffff48;
  ArrayType *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int is_class_member;
  Env *in_stack_ffffffffffffff60;
  Env *pEVar7;
  Output *in_stack_ffffffffffffff68;
  Type *in_stack_ffffffffffffff70;
  Env *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff88;
  string local_40 [32];
  void *local_20;
  ID *local_18;
  Env *local_10;
  
  is_class_member = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  Type::GenCleanUpCode
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar2 = Type::NeedsCleanUp((Type *)in_RDI[1].super_DataDepElement._vptr_DataDepElement);
  if (bVar2) {
    if (in_RDI[1].value_var_ == (ID *)0x0) {
      pvVar3 = operator_new(0x78);
      Type::value_var(in_RDI);
      pIVar4 = (ID *)ID::Name((ID *)0x122cfd);
      strfmt_abi_cxx11_((char *)local_40,"%s__elem",pIVar4);
      ID::ID(pIVar4,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_40);
      local_20 = pvVar3;
      pIVar4 = (ID *)operator_new(0xa0);
      ParseVarField::ParseVarField
                ((ParseVarField *)in_stack_ffffffffffffff60,is_class_member,
                 (ID *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      in_RDI[1].value_var_ = pIVar4;
      (**(code **)(*(long *)&((in_RDI[1].value_var_)->super_Object).filename + 0x20))
                (in_RDI[1].value_var_,local_18);
    }
    pEVar7 = local_10;
    Type::value_var(in_RDI);
    pcVar6 = Env::RValue(in_stack_ffffffffffffff78,(ID *)in_stack_ffffffffffffff70);
    Output::println((Output *)pEVar7,"if ( %s )",pcVar6);
    Output::inc_indent((Output *)local_10);
    Output::println((Output *)local_10,"{");
    pEVar7 = local_10;
    ArrayType::elem_var(in_stack_ffffffffffffff50);
    pcVar6 = Env::LValue((Env *)in_stack_ffffffffffffff50,(ID *)in_stack_ffffffffffffff48);
    pIVar4 = local_18;
    Type::value_var(in_RDI);
    pcVar5 = Env::RValue(pEVar7,pIVar4);
    Output::println((Output *)pEVar7,"for ( auto* %s : *%s )",pcVar6,pcVar5);
    Output::inc_indent((Output *)local_10);
    Output::println((Output *)local_10,"{");
    pp_Var1 = in_RDI[1].super_DataDepElement._vptr_DataDepElement;
    (**(code **)(*pp_Var1 + 0x38))(pp_Var1,local_10,local_18);
    Output::println((Output *)local_10,"}");
    Output::dec_indent((Output *)local_10);
    Output::println((Output *)local_10,"}");
    Output::dec_indent((Output *)local_10);
  }
  pcVar6 = Type::lvalue((Type *)0x122f8d);
  Output::println((Output *)local_10,"delete %s;",pcVar6);
  return;
}

Assistant:

void ArrayType::GenCleanUpCode(Output* out_cc, Env* env)
	{
	Type::GenCleanUpCode(out_cc, env);
	if ( elemtype_->NeedsCleanUp() )
		{
		if ( ! elem_var_field_ )
			{
			ID* elem_var = new ID(strfmt("%s__elem", value_var()->Name()));
			elem_var_field_ = new ParseVarField(Field::NOT_CLASS_MEMBER, elem_var, elemtype_);
			elem_var_field_->Prepare(env);
			}

		out_cc->println("if ( %s )", env->RValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");

		out_cc->println("for ( auto* %s : *%s )", env->LValue(elem_var()),
		                env->RValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		elemtype_->GenCleanUpCode(out_cc, env);
		out_cc->println("}");
		out_cc->dec_indent();

		out_cc->println("}");
		out_cc->dec_indent();
		}
	out_cc->println("delete %s;", lvalue());
	}